

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O2

void predicate_suite::test_none_of(void)

{
  bool bVar1;
  difference_type dVar2;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  size_type extraout_RDX_02;
  size_type extraout_RDX_03;
  size_type extraout_RDX_04;
  size_type extraout_RDX_05;
  size_type extraout_RDX_06;
  size_type extraout_RDX_07;
  size_type sVar3;
  size_type extraout_RDX_08;
  size_type extraout_RDX_09;
  size_type extraout_RDX_10;
  size_type extraout_RDX_11;
  size_type extraout_RDX_12;
  size_type extraout_RDX_13;
  size_type extraout_RDX_14;
  basic_iterator<int> *pbVar4;
  long lVar5;
  iterator iVar6;
  initializer_list<int> input;
  basic_iterator<int> __it;
  basic_iterator<int> __it_00;
  basic_iterator<int> __it_01;
  basic_iterator<int> __it_02;
  basic_iterator<int> __it_03;
  basic_iterator<int> __it_04;
  basic_iterator<int> __it_05;
  basic_iterator<int> __it_06;
  basic_iterator<int> __it_07;
  basic_iterator<int> __it_08;
  basic_iterator<int> __it_09;
  basic_iterator<int> __it_10;
  basic_iterator<int> __it_11;
  basic_iterator<int> __it_12;
  iterator local_98;
  iterator local_88;
  iterator local_78;
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = array;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  local_98.current = 0x2c00000021;
  local_98.parent = (view_pointer)0x160000000b;
  input._M_len = 4;
  input._M_array = (iterator)&local_98;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input);
  iVar6 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  local_98 = iVar6;
  local_78 = local_88;
  dVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator-
                    (&local_78,&local_98);
  sVar3 = extraout_RDX;
  for (lVar5 = dVar2 >> 2; 0 < lVar5; lVar5 = lVar5 + -1) {
    __it.current = sVar3;
    __it.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<predicate_suite::test_none_of()::$_0>::operator()
                      ((_Iter_pred<predicate_suite::test_none_of()::__0> *)local_98.parent,__it);
    pbVar4 = &local_98;
    if (bVar1) goto LAB_00103e52;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    __it_00.current = extraout_RDX_00;
    __it_00.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<predicate_suite::test_none_of()::$_0>::operator()
                      ((_Iter_pred<predicate_suite::test_none_of()::__0> *)local_98.parent,__it_00);
    pbVar4 = &local_98;
    if (bVar1) goto LAB_00103e52;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    __it_01.current = extraout_RDX_01;
    __it_01.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<predicate_suite::test_none_of()::$_0>::operator()
                      ((_Iter_pred<predicate_suite::test_none_of()::__0> *)local_98.parent,__it_01);
    pbVar4 = &local_98;
    if (bVar1) goto LAB_00103e52;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    __it_02.current = extraout_RDX_02;
    __it_02.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<predicate_suite::test_none_of()::$_0>::operator()
                      ((_Iter_pred<predicate_suite::test_none_of()::__0> *)local_98.parent,__it_02);
    pbVar4 = &local_98;
    if (bVar1) goto LAB_00103e52;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    sVar3 = extraout_RDX_03;
  }
  dVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator-
                    (&local_78,&local_98);
  sVar3 = extraout_RDX_04;
  if (dVar2 == 1) {
LAB_00103e35:
    __it_05.current = sVar3;
    __it_05.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<predicate_suite::test_none_of()::$_0>::operator()
                      ((_Iter_pred<predicate_suite::test_none_of()::__0> *)local_98.parent,__it_05);
    pbVar4 = &local_98;
    if (!bVar1) {
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      pbVar4 = &local_78;
    }
  }
  else if (dVar2 == 2) {
LAB_00103e1b:
    __it_04.current = sVar3;
    __it_04.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<predicate_suite::test_none_of()::$_0>::operator()
                      ((_Iter_pred<predicate_suite::test_none_of()::__0> *)local_98.parent,__it_04);
    pbVar4 = &local_98;
    if (!bVar1) {
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      sVar3 = extraout_RDX_06;
      goto LAB_00103e35;
    }
  }
  else {
    pbVar4 = &local_78;
    if (dVar2 == 3) {
      __it_03.current = extraout_RDX_04;
      __it_03.parent = (view_pointer)local_98.current;
      bVar1 = __gnu_cxx::__ops::_Iter_pred<predicate_suite::test_none_of()::$_0>::operator()
                        ((_Iter_pred<predicate_suite::test_none_of()::__0> *)local_98.parent,__it_03
                        );
      pbVar4 = &local_98;
      if (!bVar1) {
        vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++
                  (&local_98);
        sVar3 = extraout_RDX_05;
        goto LAB_00103e1b;
      }
    }
  }
LAB_00103e52:
  local_98 = *pbVar4;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_88,&local_98);
  boost::detail::test_impl
            ("!std::none_of(span.begin(), span.end(), [] (int current) { return current == 11; })",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x1bb,"void predicate_suite::test_none_of()",!bVar1);
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0x37);
  iVar6 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  local_98 = iVar6;
  local_78 = local_88;
  dVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator-
                    (&local_78,&local_98);
  sVar3 = extraout_RDX_07;
  for (lVar5 = dVar2 >> 2; 0 < lVar5; lVar5 = lVar5 + -1) {
    __it_06.current = sVar3;
    __it_06.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<predicate_suite::test_none_of()::$_1>::operator()
                      ((_Iter_pred<predicate_suite::test_none_of()::__1> *)local_98.parent,__it_06);
    pbVar4 = &local_98;
    if (bVar1) goto LAB_00103fd3;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    __it_07.current = extraout_RDX_08;
    __it_07.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<predicate_suite::test_none_of()::$_1>::operator()
                      ((_Iter_pred<predicate_suite::test_none_of()::__1> *)local_98.parent,__it_07);
    pbVar4 = &local_98;
    if (bVar1) goto LAB_00103fd3;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    __it_08.current = extraout_RDX_09;
    __it_08.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<predicate_suite::test_none_of()::$_1>::operator()
                      ((_Iter_pred<predicate_suite::test_none_of()::__1> *)local_98.parent,__it_08);
    pbVar4 = &local_98;
    if (bVar1) goto LAB_00103fd3;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    __it_09.current = extraout_RDX_10;
    __it_09.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<predicate_suite::test_none_of()::$_1>::operator()
                      ((_Iter_pred<predicate_suite::test_none_of()::__1> *)local_98.parent,__it_09);
    pbVar4 = &local_98;
    if (bVar1) goto LAB_00103fd3;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    sVar3 = extraout_RDX_11;
  }
  dVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator-
                    (&local_78,&local_98);
  sVar3 = extraout_RDX_12;
  if (dVar2 != 1) {
    if (dVar2 != 2) {
      pbVar4 = &local_78;
      if (dVar2 != 3) goto LAB_00103fd3;
      __it_10.current = extraout_RDX_12;
      __it_10.parent = (view_pointer)local_98.current;
      bVar1 = __gnu_cxx::__ops::_Iter_pred<predicate_suite::test_none_of()::$_1>::operator()
                        ((_Iter_pred<predicate_suite::test_none_of()::__1> *)local_98.parent,__it_10
                        );
      pbVar4 = &local_98;
      if (bVar1) goto LAB_00103fd3;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      sVar3 = extraout_RDX_13;
    }
    __it_11.current = sVar3;
    __it_11.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<predicate_suite::test_none_of()::$_1>::operator()
                      ((_Iter_pred<predicate_suite::test_none_of()::__1> *)local_98.parent,__it_11);
    pbVar4 = &local_98;
    if (bVar1) goto LAB_00103fd3;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    sVar3 = extraout_RDX_14;
  }
  __it_12.current = sVar3;
  __it_12.parent = (view_pointer)local_98.current;
  bVar1 = __gnu_cxx::__ops::_Iter_pred<predicate_suite::test_none_of()::$_1>::operator()
                    ((_Iter_pred<predicate_suite::test_none_of()::__1> *)local_98.parent,__it_12);
  pbVar4 = &local_98;
  if (!bVar1) {
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    pbVar4 = &local_78;
  }
LAB_00103fd3:
  local_98 = *pbVar4;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_88,&local_98);
  boost::detail::test_impl
            ("std::none_of(span.begin(), span.end(), [] (int current) { return current == 11; })",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x1bd,"void predicate_suite::test_none_of()",bVar1);
  return;
}

Assistant:

void test_none_of()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44 };
    BOOST_TEST(!std::none_of(span.begin(), span.end(), [] (int current) { return current == 11; }));
    span.push_back(55);
    BOOST_TEST(std::none_of(span.begin(), span.end(), [] (int current) { return current == 11; }));
}